

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::ShaderGLImpl::CompileShader(ShaderGLImpl *this)

{
  PFNGLCOMPILESHADERPROC p_Var1;
  PFNGLSHADERSOURCEPROC p_Var2;
  value_type_conflict4 vVar3;
  GLuint GVar4;
  value_type pcVar5;
  reference ppcVar6;
  reference pvVar7;
  size_type sVar8;
  pointer ppcVar9;
  pointer pvVar10;
  array<int,_1UL> local_1c;
  array<const_char_*,_1UL> aStack_18;
  array<int,_1UL> Lengths;
  array<const_char_*,_1UL> ShaderStrings;
  ShaderGLImpl *this_local;
  
  aStack_18._M_elems[0] = (_Type)(char *)0x0;
  local_1c._M_elems[0] = (_Type)0;
  pcVar5 = (value_type)std::__cxx11::string::c_str();
  ppcVar6 = std::array<const_char_*,_1UL>::operator[](&stack0xffffffffffffffe8,0);
  *ppcVar6 = pcVar5;
  vVar3 = std::__cxx11::string::length();
  pvVar7 = std::array<int,_1UL>::operator[](&local_1c,0);
  *pvVar7 = vVar3;
  p_Var2 = __glewShaderSource;
  GVar4 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                    ((GLObjWrapper *)&this->m_GLShaderObj);
  sVar8 = std::array<const_char_*,_1UL>::size(&stack0xffffffffffffffe8);
  ppcVar9 = std::array<const_char_*,_1UL>::data(&stack0xffffffffffffffe8);
  pvVar10 = std::array<int,_1UL>::data(&local_1c);
  (*p_Var2)(GVar4,(GLsizei)sVar8,ppcVar9,pvVar10);
  p_Var1 = __glewCompileShader;
  GVar4 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                    ((GLObjWrapper *)&this->m_GLShaderObj);
  (*p_Var1)(GVar4);
  return;
}

Assistant:

void ShaderGLImpl::CompileShader() noexcept
{
    // Note: there is a simpler way to create the program:
    //m_uiShaderSeparateProg = glCreateShaderProgramv(GL_VERTEX_SHADER, _countof(ShaderStrings), ShaderStrings);
    // NOTE: glCreateShaderProgramv() is considered equivalent to both a shader compilation and a program linking
    // operation. Since it performs both at the same time, compiler or linker errors can be encountered. However,
    // since this function only returns a program object, compiler-type errors will be reported as linker errors
    // through the following API:
    // GLint isLinked = 0;
    // glGetProgramiv(program, GL_LINK_STATUS, &isLinked);
    // The log can then be queried in the same way


    // Each element in the length array may contain the length of the corresponding string
    // (the null character is not counted as part of the string length).
    // Not specifying lengths causes shader compilation errors on Android
    std::array<const char*, 1> ShaderStrings = {};
    std::array<GLint, 1>       Lengths       = {};

    ShaderStrings[0] = m_GLSLSourceString.c_str();
    Lengths[0]       = static_cast<GLint>(m_GLSLSourceString.length());

    // Provide source strings (the strings will be saved in internal OpenGL memory)
    glShaderSource(m_GLShaderObj, static_cast<GLsizei>(ShaderStrings.size()), ShaderStrings.data(), Lengths.data());
    // When the shader is compiled, it will be compiled as if all of the given strings were concatenated end-to-end.
    glCompileShader(m_GLShaderObj);
}